

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O3

void __thiscall
myvk::CommandBuffer::CmdCopy
          (CommandBuffer *this,Ptr<ImageBase> *src,Ptr<ImageBase> *dst,
          vector<VkImageCopy,_std::allocator<VkImageCopy>_> *regions,VkImageLayout src_layout,
          VkImageLayout dst_layout)

{
  (*vkCmdCopyImage)(this->m_command_buffer,
                    ((src->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                    ->m_image,src_layout,
                    ((dst->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                    ->m_image,dst_layout,
                    (int)((ulong)(*(long *)(regions + 8) - (long)*(VkImageCopy **)regions) >> 2) *
                    -0xf0f0f0f,*(VkImageCopy **)regions);
  return;
}

Assistant:

void CommandBuffer::CmdCopy(const Ptr<ImageBase> &src, const Ptr<ImageBase> &dst,
                            const std::vector<VkImageCopy> &regions, VkImageLayout src_layout,
                            VkImageLayout dst_layout) const {
	vkCmdCopyImage(m_command_buffer, src->GetHandle(), src_layout, dst->GetHandle(), dst_layout, regions.size(),
	               regions.data());
}